

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.cpp
# Opt level: O1

void mbedtls_cipher_free(mbedtls_cipher_context_t *ctx)

{
  if (ctx != (mbedtls_cipher_context_t *)0x0) {
    if (ctx->cipher_ctx != (void *)0x0) {
      (**(code **)(*(long *)((long)mbedtls_cipher_base_lookup_table +
                            (ulong)(*(uint *)&ctx->cipher_info->field_0x8 >> 0x17 & 0xf8)) + 0x28))
                ();
    }
    mbedtls_platform_zeroize(ctx,0x48);
    return;
  }
  return;
}

Assistant:

void mbedtls_cipher_free(mbedtls_cipher_context_t *ctx)
{
    if (ctx == NULL) {
        return;
    }

#if defined(MBEDTLS_USE_PSA_CRYPTO) && !defined(MBEDTLS_DEPRECATED_REMOVED)
    if (ctx->psa_enabled == 1) {
        if (ctx->cipher_ctx != NULL) {
            mbedtls_cipher_context_psa * const cipher_psa =
                (mbedtls_cipher_context_psa *) ctx->cipher_ctx;

            if (cipher_psa->slot_state == MBEDTLS_CIPHER_PSA_KEY_OWNED) {
                /* xxx_free() doesn't allow to return failures. */
                (void) psa_destroy_key(cipher_psa->slot);
            }

            mbedtls_zeroize_and_free(cipher_psa, sizeof(*cipher_psa));
        }

        mbedtls_platform_zeroize(ctx, sizeof(mbedtls_cipher_context_t));
        return;
    }
#endif /* MBEDTLS_USE_PSA_CRYPTO && !MBEDTLS_DEPRECATED_REMOVED */

#if defined(MBEDTLS_CMAC_C)
    if (ctx->cmac_ctx) {
        mbedtls_zeroize_and_free(ctx->cmac_ctx,
                                 sizeof(mbedtls_cmac_context_t));
    }
#endif

    if (ctx->cipher_ctx) {
        mbedtls_cipher_get_base(ctx->cipher_info)->ctx_free_func(ctx->cipher_ctx);
    }

    mbedtls_platform_zeroize(ctx, sizeof(mbedtls_cipher_context_t));
}